

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O1

void __thiscall
duckdb::PreparedStatement::PreparedStatement
          (PreparedStatement *this,shared_ptr<duckdb::ClientContext,_true> *context,
          shared_ptr<duckdb::PreparedStatementData,_true> *data_p,string *query,
          case_insensitive_map_t<idx_t> *named_param_map_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  undefined8 uVar7;
  
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (context->internal).super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var5 = (context->internal).super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (context->internal).super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  (context->internal).super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data).internal.
  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar6 = (data_p->internal).
           super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (data_p->internal).
           super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (data_p->internal).super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->data).internal.
  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (this->data).internal.
  super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  (data_p->internal).super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  paVar1 = &(this->query).field_2;
  (this->query)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (query->_M_dataplus)._M_p;
  paVar2 = &query->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar7 = *(undefined8 *)((long)&query->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->query).field_2 + 8) = uVar7;
  }
  else {
    (this->query)._M_dataplus._M_p = pcVar3;
    (this->query).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->query)._M_string_length = query->_M_string_length;
  (query->_M_dataplus)._M_p = (pointer)paVar2;
  query->_M_string_length = 0;
  (query->field_2)._M_local_buf[0] = '\0';
  this->success = true;
  ErrorData::ErrorData(&this->error);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&this->named_param_map,named_param_map_p,named_param_map_p);
  return;
}

Assistant:

PreparedStatement::PreparedStatement(shared_ptr<ClientContext> context, shared_ptr<PreparedStatementData> data_p,
                                     string query, case_insensitive_map_t<idx_t> named_param_map_p)
    : context(std::move(context)), data(std::move(data_p)), query(std::move(query)), success(true),
      named_param_map(std::move(named_param_map_p)) {
	D_ASSERT(data || !success);
}